

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

void __thiscall libchars::command_cursor::rewind(command_cursor *this,FILE *__stream)

{
  undefined1 local_60 [8];
  command_node_stack_t empty;
  command_cursor *this_local;
  
  empty.c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)this;
  std::
  stack<libchars::command_node*,std::deque<libchars::command_node*,std::allocator<libchars::command_node*>>>
  ::stack<std::deque<libchars::command_node*,std::allocator<libchars::command_node*>>,void>
            ((stack<libchars::command_node*,std::deque<libchars::command_node*,std::allocator<libchars::command_node*>>>
              *)local_60);
  std::
  swap<libchars::command_node*,std::deque<libchars::command_node*,std::allocator<libchars::command_node*>>>
            (&this->S,(stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
                       *)local_60);
  std::__cxx11::string::clear();
  this->idx = 0;
  std::
  stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
  ::~stack((stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
            *)local_60);
  return;
}

Assistant:

void command_cursor::rewind()
    {
        command_node_stack_t empty;
        std::swap(S,empty);
        w.clear();
        idx = 0;
    }